

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHashByTaproot
          (ConfidentialTransactionContext *this,OutPoint *outpoint,SigHashType *sighash_type,
          ByteData256 *tap_leaf_hash,uint32_t *code_separator_position,ByteData *annex)

{
  bool bVar1;
  uint32_t uVar2;
  UtxoData *pUVar3;
  undefined8 uVar4;
  CfdException *this_00;
  SigHashType *in_RCX;
  undefined8 in_RDX;
  ConfidentialTransaction *in_RSI;
  UtxoData *in_RDI;
  ByteData256 *in_R8;
  uint32_t *in_R9;
  ByteData *in_stack_00000008;
  TapScriptData script_data;
  ByteData annex_data;
  uint32_t txin_index;
  BlockHash genesis_blockhash;
  ConfidentialAssetId asset;
  ConfidentialValue value;
  Script locking_script;
  OutPoint target_outpoint;
  value_type *txin_ref;
  size_t index;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxos;
  UtxoData utxo;
  Script *in_stack_fffffffffffff710;
  UtxoData *pUVar5;
  ConfidentialTxOut *in_stack_fffffffffffff718;
  string *in_stack_fffffffffffff720;
  TapScriptData *script_data_00;
  CfdError in_stack_fffffffffffff72c;
  CfdException *in_stack_fffffffffffff730;
  ConfidentialTransactionContext *in_stack_fffffffffffff768;
  allocator *paVar6;
  UtxoData *this_01;
  SigHashType local_864;
  TapScriptData local_858;
  ByteData local_838;
  uint32_t local_81c;
  BlockHash local_818;
  ConfidentialTxOut local_7f8;
  undefined1 local_6fa;
  allocator local_6f9;
  string local_6f8 [48];
  UtxoData *in_stack_fffffffffffff938;
  allocator local_6a9;
  string local_6a8 [32];
  ConfidentialAssetId local_688;
  ConfidentialValue local_660;
  Script local_638;
  undefined1 local_5fa;
  allocator local_5f9;
  string local_5f8 [48];
  Txid local_5c8;
  OutPoint local_5a8;
  const_reference local_580;
  UtxoData *local_578;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> local_570 [26]
  ;
  Amount local_2f8 [2];
  ConfidentialAssetId local_2d8 [12];
  BlindFactor local_f8;
  BlindFactor local_d8;
  ConfidentialValue local_b8;
  ConfidentialAssetId local_90 [2];
  uint32_t *local_30;
  ByteData256 *local_28;
  SigHashType *local_20;
  undefined8 local_18;
  
  this_01 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  UtxoData::UtxoData(in_RDI);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            (local_570);
  local_578 = (UtxoData *)0x0;
  while( true ) {
    pUVar5 = local_578;
    pUVar3 = (UtxoData *)
             std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ::size(&in_RSI->vin_);
    if (pUVar3 <= pUVar5) {
      GetGenesisBlockHash(in_stack_fffffffffffff768);
      local_81c = (*(in_RSI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])
                            (in_RSI,local_18);
      core::ByteData::ByteData(&local_838);
      if (in_stack_00000008 != (ByteData *)0x0) {
        core::ByteData::operator=(&local_838,in_stack_00000008);
      }
      core::TapScriptData::TapScriptData((TapScriptData *)in_stack_fffffffffffff710);
      if ((local_28 != (ByteData256 *)0x0) &&
         (core::ByteData256::operator=(&local_858.tap_leaf_hash,local_28),
         local_30 != (uint32_t *)0x0)) {
        local_858.code_separator_position = *local_30;
      }
      uVar2 = local_81c;
      core::SigHashType::SigHashType(&local_864,local_20);
      if (local_28 == (ByteData256 *)0x0) {
        script_data_00 = (TapScriptData *)0x0;
      }
      else {
        script_data_00 = &local_858;
      }
      pUVar5 = (UtxoData *)&local_838;
      core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
                ((ByteData256 *)in_RDI,in_RSI,uVar2,&local_864,&local_818,local_570,script_data_00,
                 (ByteData *)pUVar5);
      core::TapScriptData::~TapScriptData((TapScriptData *)0x582c50);
      core::ByteData::~ByteData((ByteData *)0x582c5d);
      core::BlockHash::~BlockHash((BlockHash *)0x582c6a);
      std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      ~vector((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *
              )script_data_00);
      UtxoData::~UtxoData(pUVar5);
      return (ByteData256 *)this_01;
    }
    local_580 = std::
                vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
                operator[](&in_RSI->vin_,(size_type)local_578);
    core::AbstractTxIn::GetTxid(&local_5c8,&local_580->super_AbstractTxIn);
    uVar2 = core::AbstractTxIn::GetVout(&local_580->super_AbstractTxIn);
    core::OutPoint::OutPoint(&local_5a8,&local_5c8,uVar2);
    core::Txid::~Txid((Txid *)0x582487);
    bVar1 = IsFindUtxoMap((ConfidentialTransactionContext *)this_01,(OutPoint *)in_RDI,pUVar5);
    if (!bVar1) break;
    GetLockingScriptFromUtxoData(in_stack_fffffffffffff938);
    core::ConfidentialValue::ConfidentialValue(&local_660,local_2f8);
    core::ConfidentialAssetId::ConfidentialAssetId(&local_688,local_2d8);
    bVar1 = core::ConfidentialValue::HasBlinding(&local_b8);
    if (bVar1) {
      core::ConfidentialValue::operator=(&local_660,&local_b8);
      bVar1 = core::ConfidentialAssetId::HasBlinding(&local_688);
      if (!bVar1) {
        bVar1 = core::ConfidentialAssetId::HasBlinding(local_90);
        if (bVar1) {
          core::ConfidentialAssetId::operator=(&local_688,local_90);
        }
        else {
          bVar1 = core::BlindFactor::IsEmpty(&local_f8);
          if ((bVar1) || (bVar1 = core::BlindFactor::IsEmpty(&local_d8), bVar1)) {
            uVar4 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_6a8,
                       "Utxo asset and blindFactor is unmatch. CreateSignatureHashByTaproot fail.",
                       &local_6a9);
            core::CfdException::CfdException
                      (in_stack_fffffffffffff730,in_stack_fffffffffffff72c,in_stack_fffffffffffff720
                      );
            __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          core::ConfidentialAssetId::GetCommitment
                    ((ConfidentialAssetId *)(local_6f8 + 0x20),&local_688,&local_f8);
          core::ConfidentialAssetId::operator=(&local_688,(ConfidentialAssetId *)(local_6f8 + 0x20))
          ;
          core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x582874);
        }
      }
    }
    else {
      bVar1 = core::ConfidentialAssetId::HasBlinding(&local_688);
      if (bVar1) {
        local_6fa = 1;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_6f8,"Utxo asset is unmatch. CreateSignatureHashByTaproot fail.",&local_6f9)
        ;
        core::CfdException::CfdException
                  (this_00,in_stack_fffffffffffff72c,in_stack_fffffffffffff720);
        local_6fa = 0;
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    core::ConfidentialTxOut::ConfidentialTxOut(&local_7f8,&local_638,&local_688,&local_660);
    std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    emplace_back<cfd::core::ConfidentialTxOut>
              ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    core::ConfidentialTxOut::~ConfidentialTxOut(&local_7f8);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x582a00);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x582a0d);
    core::Script::~Script(in_stack_fffffffffffff710);
    core::OutPoint::~OutPoint((OutPoint *)0x582a27);
    local_578 = (UtxoData *)((long)&local_578->block_height + 1);
  }
  local_5fa = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  paVar6 = &local_5f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5f8,"Utxo is not found. CreateSignatureHashByTaproot fail.",paVar6);
  core::CfdException::CfdException
            (in_stack_fffffffffffff730,in_stack_fffffffffffff72c,in_stack_fffffffffffff720);
  local_5fa = 0;
  __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ByteData256 ConfidentialTransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<ConfidentialTxOut> utxos;
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    Script locking_script = GetLockingScriptFromUtxoData(utxo);
    ConfidentialValue value(utxo.amount);
    ConfidentialAssetId asset = utxo.asset;
    if (utxo.value_commitment.HasBlinding()) {
      value = utxo.value_commitment;
      if (asset.HasBlinding()) {
        // fall-through
      } else if (utxo.asset_commitment.HasBlinding()) {
        asset = utxo.asset_commitment;
      } else if (
          utxo.asset_blind_factor.IsEmpty() ||
          utxo.amount_blind_factor.IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo asset and blindFactor is unmatch. "
            "CreateSignatureHashByTaproot fail.");  // NOLINT
      } else {
        asset =
            ConfidentialAssetId::GetCommitment(asset, utxo.asset_blind_factor);
      }
    } else if (asset.HasBlinding()) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo asset is unmatch. CreateSignatureHashByTaproot fail.");
    }
    utxos.emplace_back(ConfidentialTxOut(locking_script, asset, value));
  }
  BlockHash genesis_blockhash = GetGenesisBlockHash();

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetElementsSchnorrSignatureHash(
      txin_index, sighash_type, genesis_blockhash, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}